

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O3

void vkt::shaderexecutor::generateSources
               (ShaderType shaderType,ShaderSpec *shaderSpec,SourceCollections *dst)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  DataType DVar6;
  istream *piVar7;
  ProgramSources *pPVar8;
  ostream *poVar9;
  char *pcVar10;
  size_t sVar11;
  InternalError *this;
  uint *inputPrefix;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs_00;
  int ndx;
  int iVar12;
  pointer pSVar13;
  pointer ppSVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  string *in_R8;
  string *in_R9;
  VarType *pVVar17;
  bool bVar18;
  string line;
  FragmentOutputLayout outputLayout;
  istringstream opSrc;
  ostringstream src;
  VarType intType;
  undefined1 local_460 [32];
  ProgramSources *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string local_3f0;
  undefined1 local_3d0 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_3b8;
  undefined1 local_388 [32];
  ProgramSources *local_368;
  long *local_360;
  long local_358;
  long local_350 [2];
  undefined1 local_340 [16];
  undefined1 local_330 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [4];
  ios_base local_2d0 [8];
  ios_base local_2c8 [264];
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [6];
  ios_base local_150 [264];
  VarType local_48;
  
  inputPrefix = &switchD_00804b61::switchdataD_00b2b3a4;
  local_440 = (ProgramSources *)dst;
  switch(shaderType) {
  case SHADERTYPE_VERTEX:
    anon_unknown_0::computeFragmentOutputLayout
              ((FragmentOutputLayout *)local_3d0,&shaderSpec->outputs);
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x6576;
    local_3f0.field_2._M_local_buf[2] = 'r';
    local_3f0.field_2._M_local_buf[3] = 't';
    local_3f0._M_string_length = 4;
    local_3f0.field_2._M_allocated_capacity._4_4_ =
         local_3f0.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_368 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_440,&local_3f0);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    local_438._M_string_length = 2;
    local_438.field_2._M_allocated_capacity._0_3_ = 0x5f61;
    local_388._0_8_ = local_388 + 0x10;
    local_388._16_8_ = 0x5f74756f5f787476;
    local_388._8_8_ = 8;
    local_388._24_2_ = (ushort)(byte)local_388[0x19] << 8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"#version 310 es\n",0x10);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
    pSVar13 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar12 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"layout(location = ",0x12);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") in ",5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460,&local_438,&pSVar13->name);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_340,&pSVar13->varType,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,0)
        ;
        poVar9 = glu::decl::operator<<(poVar9,(DeclareVariable *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          local_318[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_340);
        if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
          operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
        }
        iVar12 = iVar12 + 1;
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar13 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar12 = 0;
      pVVar17 = &pSVar13->varType;
      do {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&pVVar17[-2].m_data + 8);
        DVar6 = (pVVar17->m_data).basic.type;
        if (DVar6 - TYPE_BOOL < 4) {
          iVar5 = glu::getDataTypeScalarSize(DVar6);
          DVar6 = TYPE_INT;
          if (1 < iVar5) {
            DVar6 = glu::getDataTypeIntVec(iVar5);
          }
          glu::VarType::VarType(&local_48,DVar6,PRECISION_HIGHP);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"layout(location = ",0x12);
          poVar9 = (ostream *)std::ostream::operator<<(local_1c0,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") flat out ",0xb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_460,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388,pbVar1);
          glu::decl::DeclareVariable::DeclareVariable
                    ((DeclareVariable *)local_340,&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     0);
          poVar9 = glu::decl::operator<<(poVar9,(DeclareVariable *)local_340);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_allocated_capacity != local_318) {
            operator_delete((void *)local_328._M_allocated_capacity,
                            local_318[0]._M_allocated_capacity + 1);
          }
          glu::VarType::~VarType((VarType *)local_340);
          if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
            operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
          }
          glu::VarType::~VarType(&local_48);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"layout(location = ",0x12);
          poVar9 = (ostream *)std::ostream::operator<<(local_1c0,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") flat out ",0xb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_460,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388,pbVar1);
          glu::decl::DeclareVariable::DeclareVariable
                    ((DeclareVariable *)local_340,pVVar17,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     0);
          poVar9 = glu::decl::operator<<(poVar9,(DeclareVariable *)local_340);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_allocated_capacity != local_318) {
            operator_delete((void *)local_328._M_allocated_capacity,
                            local_318[0]._M_allocated_capacity + 1);
          }
          glu::VarType::~VarType((VarType *)local_340);
          if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
            operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
          }
        }
        iVar12 = iVar12 + 1;
        pSVar13 = (pointer)(pVVar17 + 1);
        pVVar17 = (VarType *)&pVVar17[2].m_data;
      } while (pSVar13 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\tgl_Position = a_position;\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\tgl_PointSize = 1.0;\n",0x15);
    pSVar13 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_340,&pSVar13->varType,&pSVar13->name,0);
        poVar9 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_438._M_dataplus._M_p,local_438._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pSVar13->name)._M_dataplus._M_p,(pSVar13->name)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          local_318[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_340);
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar13 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_340,&pSVar13->varType,&pSVar13->name,0);
        poVar9 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          local_318[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_340);
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_340,(string *)&shaderSpec->source,_S_in);
    local_460._0_8_ = local_460 + 0x10;
    local_460._8_8_ = 0;
    local_460._16_8_ = local_460._16_8_ & 0xffffffffffffff00;
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_340._0_8_ + -0x18) +
                              (char)(istringstream *)local_340);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_340,(string *)local_460,cVar4);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(char *)local_460._0_8_,local_460._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_340);
    std::ios_base::~ios_base(local_2c8);
    pSVar13 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        DVar6 = (pSVar13->varType).m_data.basic.type;
        if (DVar6 - TYPE_BOOL < 4) {
          iVar12 = glu::getDataTypeScalarSize(DVar6);
          DVar6 = TYPE_INT;
          if (1 < iVar12) {
            DVar6 = glu::getDataTypeIntVec(iVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c0,(char *)local_388._0_8_,local_388._8_8_);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pSVar13->name)._M_dataplus._M_p,
                              (pSVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
          pcVar10 = glu::getDataTypeName(DVar6);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pSVar13->name)._M_dataplus._M_p,
                              (pSVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c0,(char *)local_388._0_8_,local_388._8_8_);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pSVar13->name)._M_dataplus._M_p,
                              (pSVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pSVar13->name)._M_dataplus._M_p,
                              (pSVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        }
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    local_418._0_4_ = 0;
    local_418._8_8_ = local_408._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_418 + 8),local_360,local_358 + (long)local_360);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_368->sources + (uint)local_418._0_4_,(value_type *)(local_418 + 8));
    if ((char *)local_418._8_8_ != local_408._M_local_buf + 8) {
      operator_delete((void *)local_418._8_8_,local_408._8_8_ + 1);
    }
    if (local_360 != local_350) {
      operator_delete(local_360,local_350[0] + 1);
    }
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x67617266;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    local_1c0._0_8_ = local_1b0;
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    local_460._0_8_ = local_460 + 0x10;
    local_460._16_8_ = 0x5f74756f5f787476;
    local_460._8_8_ = 8;
    local_460._24_2_ = (ushort)(byte)local_460[0x19] << 8;
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x5f6f;
    local_3f0._M_string_length = 2;
    local_3f0.field_2._M_local_buf[2] = '\0';
    anon_unknown_0::generatePassthroughFragmentShader
              ((string *)local_418,shaderSpec,SUB81(&local_3b8,0),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_460,&local_3f0,in_R9);
    local_340._0_4_ = 1;
    local_340._8_8_ = &local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_340 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_340._0_8_ & 0xffffffff),(value_type *)(local_340 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != &local_328) {
      operator_delete((void *)local_340._8_8_,(ulong)(local_328._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
LAB_00807444:
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    break;
  case SHADERTYPE_FRAGMENT:
    anon_unknown_0::computeFragmentOutputLayout
              ((FragmentOutputLayout *)local_3d0,&shaderSpec->outputs);
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x74726576;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    local_1c0._0_8_ = local_1b0;
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    (anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
              ((string *)local_418,(_anonymous_namespace_ *)shaderSpec,inputs_00,(char *)inputPrefix
               ,(char *)in_R8);
    local_340._0_8_ = (ulong)(uint)local_340._4_4_ << 0x20;
    local_340._8_8_ = &local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_340 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_340._0_8_ & 0xffffffff),(value_type *)(local_340 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != &local_328) {
      operator_delete((void *)local_340._8_8_,(ulong)(local_328._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x7266;
    local_3f0.field_2._M_local_buf[2] = 'a';
    local_3f0.field_2._M_local_buf[3] = 'g';
    local_3f0._M_string_length = 4;
    local_3f0.field_2._M_allocated_capacity._4_4_ =
         local_3f0.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_440 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_440,&local_3f0);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    local_438.field_2._M_allocated_capacity = 0x5f74756f5f787476;
    local_438._M_string_length = 8;
    local_438.field_2._M_local_buf[8] = '\0';
    local_388._0_8_ = local_388 + 0x10;
    local_388._8_8_ = 2;
    local_388._16_3_ = 0x5f6f;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"#version 310 es\n",0x10);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    pSVar13 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"layout(location = ",0x12);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") flat in ",10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460,&local_438,&pSVar13->name);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_340,&pSVar13->varType,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,0)
        ;
        poVar9 = glu::decl::operator<<(poVar9,(DeclareVariable *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          local_318[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_340);
        if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
          operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
        }
        iVar12 = iVar12 + 1;
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    anon_unknown_0::generateFragShaderOutputDecl
              ((ostream *)local_1c0,shaderSpec,SUB81(&local_3b8,0),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_388,in_R8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\nvoid main (void)\n{\n",0x14);
    pSVar13 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_340,&pSVar13->varType,&pSVar13->name,0);
        poVar9 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_438._M_dataplus._M_p,local_438._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pSVar13->name)._M_dataplus._M_p,(pSVar13->name)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          local_318[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_340);
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar13 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_340,&pSVar13->varType,&pSVar13->name,0);
        poVar9 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          local_318[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_340);
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_340,(string *)&shaderSpec->source,_S_in);
    local_460._8_8_ = 0;
    local_460._16_8_ = local_460._16_8_ & 0xffffffffffffff00;
    local_460._0_8_ = local_460 + 0x10;
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_340._0_8_ - 0x18) +
                              (char)(istringstream *)local_340);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_340,(string *)local_460,cVar4);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(char *)local_460._0_8_,local_460._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_340);
    std::ios_base::~ios_base(local_2c8);
    local_340._8_4_ = TYPE_INVALID;
    local_340._12_4_ = PRECISION_LOWP;
    local_330[0] = 0;
    local_340._0_8_ = local_330;
    anon_unknown_0::generateFragShaderOutAssign
              ((ostream *)local_1c0,shaderSpec,SUB81(local_340,0),(string *)local_388,in_R8);
    if ((undefined1 *)local_340._0_8_ != local_330) {
      operator_delete((void *)local_340._0_8_,CONCAT71(local_330._1_7_,local_330[0]) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    local_418._0_4_ = 1;
    local_418._8_8_ = local_408._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_418 + 8),local_360,local_358 + (long)local_360);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_440->sources + (uint)local_418._0_4_,(value_type *)(local_418 + 8));
    if ((char *)local_418._8_8_ != local_408._M_local_buf + 8) {
      operator_delete((void *)local_418._8_8_,local_408._8_8_ + 1);
    }
    if (local_360 != local_350) {
      operator_delete(local_360,local_350[0] + 1);
    }
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    break;
  case SHADERTYPE_GEOMETRY:
    anon_unknown_0::computeFragmentOutputLayout
              ((FragmentOutputLayout *)local_3d0,&shaderSpec->outputs);
    local_1c0._0_8_ = local_1b0;
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x74726576;
    local_1c0._8_8_ = 4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    (anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
              ((string *)local_418,(_anonymous_namespace_ *)shaderSpec,inputs,(char *)inputPrefix,
               (char *)in_R8);
    local_340._0_8_ = (ulong)(uint)local_340._4_4_ << 0x20;
    local_340._8_8_ = &local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_340 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_340._0_8_ & 0xffffffff),(value_type *)(local_340 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != &local_328) {
      operator_delete((void *)local_340._8_8_,(ulong)(local_328._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x6567;
    local_3f0.field_2._M_local_buf[2] = 'o';
    local_3f0.field_2._M_local_buf[3] = 'm';
    local_3f0._M_string_length = 4;
    local_3f0.field_2._M_allocated_capacity._4_4_ =
         local_3f0.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_368 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_440,&local_3f0);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    local_438.field_2._M_allocated_capacity = 0x5f74756f5f787476;
    local_438._M_string_length = 8;
    local_438.field_2._M_local_buf[8] = '\0';
    local_388._0_8_ = local_388 + 0x10;
    local_388._16_8_ = 0x74756f5f6d6f6567;
    local_388._24_2_ = 0x5f;
    local_388._8_8_ = 9;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"#version 310 es\n#extension GL_EXT_geometry_shader : require\n"
               ,0x3c);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"layout(points) in;\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"layout(points, max_vertices = 1) out;\n",0x26);
    pSVar13 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"layout(location = ",0x12);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") flat in ",10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460,&local_438,&pSVar13->name);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_340,&pSVar13->varType,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,0)
        ;
        poVar9 = glu::decl::operator<<(poVar9,(DeclareVariable *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[];\n",4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          local_318[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_340);
        if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
          operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
        }
        iVar12 = iVar12 + 1;
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar13 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar12 = 0;
      pVVar17 = &pSVar13->varType;
      do {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&pVVar17[-2].m_data + 8);
        DVar6 = (pVVar17->m_data).basic.type;
        if (DVar6 - TYPE_BOOL < 4) {
          iVar5 = glu::getDataTypeScalarSize(DVar6);
          DVar6 = TYPE_INT;
          if (1 < iVar5) {
            DVar6 = glu::getDataTypeIntVec(iVar5);
          }
          glu::VarType::VarType(&local_48,DVar6,PRECISION_HIGHP);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"layout(location = ",0x12);
          poVar9 = (ostream *)std::ostream::operator<<(local_1c0,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") flat out ",0xb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_460,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388,pbVar1);
          glu::decl::DeclareVariable::DeclareVariable
                    ((DeclareVariable *)local_340,&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     0);
          poVar9 = glu::decl::operator<<(poVar9,(DeclareVariable *)local_340);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_allocated_capacity != local_318) {
            operator_delete((void *)local_328._M_allocated_capacity,
                            local_318[0]._M_allocated_capacity + 1);
          }
          glu::VarType::~VarType((VarType *)local_340);
          if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
            operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
          }
          glu::VarType::~VarType(&local_48);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"layout(location = ",0x12);
          poVar9 = (ostream *)std::ostream::operator<<(local_1c0,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") flat out ",0xb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_460,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388,pbVar1);
          glu::decl::DeclareVariable::DeclareVariable
                    ((DeclareVariable *)local_340,pVVar17,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     0);
          poVar9 = glu::decl::operator<<(poVar9,(DeclareVariable *)local_340);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_allocated_capacity != local_318) {
            operator_delete((void *)local_328._M_allocated_capacity,
                            local_318[0]._M_allocated_capacity + 1);
          }
          glu::VarType::~VarType((VarType *)local_340);
          if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
            operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
          }
        }
        iVar12 = iVar12 + 1;
        pSVar13 = (pointer)(pVVar17 + 1);
        pVVar17 = (VarType *)&pVVar17[2].m_data;
      } while (pSVar13 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\tgl_Position = gl_in[0].gl_Position;\n\n",0x26);
    pSVar13 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_340,&pSVar13->varType,&pSVar13->name,0);
        poVar9 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_438._M_dataplus._M_p,local_438._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pSVar13->name)._M_dataplus._M_p,(pSVar13->name)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[0];\n",5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          local_318[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_340);
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar13 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_340,&pSVar13->varType,&pSVar13->name,0);
        poVar9 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          local_318[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_340);
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_340,(string *)&shaderSpec->source,_S_in);
    local_460._0_8_ = local_460 + 0x10;
    local_460._8_8_ = 0;
    local_460._16_8_ = local_460._16_8_ & 0xffffffffffffff00;
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_340._0_8_ - 0x18) +
                              (char)(istringstream *)local_340);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_340,(string *)local_460,cVar4);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(char *)local_460._0_8_,local_460._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_340);
    std::ios_base::~ios_base(local_2c8);
    pSVar13 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar13 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        DVar6 = (pSVar13->varType).m_data.basic.type;
        if (DVar6 - TYPE_BOOL < 4) {
          iVar12 = glu::getDataTypeScalarSize(DVar6);
          DVar6 = TYPE_INT;
          if (1 < iVar12) {
            DVar6 = glu::getDataTypeIntVec(iVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c0,(char *)local_388._0_8_,local_388._8_8_);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pSVar13->name)._M_dataplus._M_p,
                              (pSVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
          pcVar10 = glu::getDataTypeName(DVar6);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pSVar13->name)._M_dataplus._M_p,
                              (pSVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c0,(char *)local_388._0_8_,local_388._8_8_);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pSVar13->name)._M_dataplus._M_p,
                              (pSVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pSVar13->name)._M_dataplus._M_p,
                              (pSVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        }
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\tEmitVertex();\n",0xf)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\tEndPrimitive();\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    local_418._0_4_ = 2;
    local_418._8_8_ = local_408._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_418 + 8),local_360,local_358 + (long)local_360);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_368->sources + (uint)local_418._0_4_,(value_type *)(local_418 + 8));
    if ((char *)local_418._8_8_ != local_408._M_local_buf + 8) {
      operator_delete((void *)local_418._8_8_,local_408._8_8_ + 1);
    }
    if (local_360 != local_350) {
      operator_delete(local_360,local_350[0] + 1);
    }
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    local_1c0._0_8_ = local_1b0;
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x67617266;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    local_460._0_8_ = local_460 + 0x10;
    local_460._16_8_ = 0x74756f5f6d6f6567;
    local_460._24_2_ = 0x5f;
    local_460._8_8_ = 9;
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x5f6f;
    local_3f0._M_string_length = 2;
    local_3f0.field_2._M_local_buf[2] = '\0';
    anon_unknown_0::generatePassthroughFragmentShader
              ((string *)local_418,shaderSpec,SUB81(&local_3b8,0),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_460,&local_3f0,in_R9);
    local_340._0_4_ = 1;
    local_340._8_8_ = &local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_340 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_340._0_8_ & 0xffffffff),(value_type *)(local_340 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != &local_328) {
      operator_delete((void *)local_340._8_8_,(ulong)(local_328._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) goto LAB_00807444;
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x74726576;
    local_1c0._8_8_ = 4;
    local_1b0[0]._M_allocated_capacity._4_4_ = (uint)(uint3)local_1b0[0]._5_3_ << 8;
    local_1c0._0_8_ = local_1b0;
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&dst->glslSources,(string *)local_1c0);
    (anonymous_namespace)::generateVertexShaderForTess_abi_cxx11_();
    local_340._0_8_ = (ulong)(uint)local_340._4_4_ << 0x20;
    local_340._8_8_ = &local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_340 + 8),local_3d0._0_8_,
               (pointer)(local_3d0._8_8_ + local_3d0._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_340._0_8_ & 0xffffffff),(value_type *)(local_340 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != &local_328) {
      operator_delete((void *)local_340._8_8_,(ulong)(local_328._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    local_3d0._16_8_ = (pointer)0x6e6f635f73736574;
    local_3b8._M_impl._0_4_ = 0x6c6f7274;
    local_3d0._8_8_ = (pointer)0xc;
    local_3b8._M_impl._4_1_ = '\0';
    local_3d0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_3d0 + 0x10);
    local_368 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_3d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n",0x41);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_340,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\nlayout(vertices = 1) out;\n\n",0x1c);
    anon_unknown_0::BufferIoExecutor::declareBufferBlocks((ostream *)local_340,shaderSpec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"void main (void)\n{\n",0x13);
    iVar5 = 0;
    iVar12 = 0;
    bVar3 = true;
    do {
      bVar18 = bVar3;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_TessLevelInner[",0x13);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_340,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] = 1.0;\n",9);
      iVar5 = 1;
      bVar3 = false;
    } while (bVar18);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_3d0 + 0x10);
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_TessLevelOuter[",0x13);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_340,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] = 1.0;\n",9);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\thighp uint invocationId = uint(gl_PrimitiveID);\n",0x31);
    anon_unknown_0::BufferIoExecutor::generateExecBufferIo
              ((ostream *)local_340,shaderSpec,"invocationId");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
    std::ios_base::~ios_base(local_2d0);
    local_1c0._0_4_ = 3;
    pcVar10 = local_1b0[0]._M_local_buf + 8;
    local_1c0._8_8_ = pcVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_368->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != pcVar10) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ != paVar16) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    local_3d0._16_8_ = (pointer)0x6176655f73736574;
    local_3b8._M_impl._0_2_ = 0x6c;
    local_3d0._8_8_ = (pointer)0x9;
    local_3d0._0_8_ = paVar16;
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_3d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(triangles, ccw) in;\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\nvoid main (void)\n{\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\tgl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
    std::ios_base::~ios_base(local_2d0);
    local_1c0._0_4_ = 4;
    local_1c0._8_8_ = pcVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != pcVar10) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ != paVar16) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x67617266;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    local_1c0._0_8_ = local_1b0;
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    (anonymous_namespace)::generateEmptyFragmentSource_abi_cxx11_();
    local_340._0_4_ = 1;
    local_340._8_8_ = &local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_340 + 8),local_3d0._0_8_,
               (pointer)(local_3d0._8_8_ + local_3d0._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_340._0_8_ & 0xffffffff),(value_type *)(local_340 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != &local_328) {
      operator_delete((void *)local_340._8_8_,(ulong)(local_328._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ != paVar16) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ == local_1b0) {
      return;
    }
    goto LAB_00806670;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x74726576;
    local_1c0._8_8_ = 4;
    local_1b0[0]._M_allocated_capacity._4_4_ = (uint)(uint3)local_1b0[0]._5_3_ << 8;
    local_1c0._0_8_ = local_1b0;
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&dst->glslSources,(string *)local_1c0);
    (anonymous_namespace)::generateVertexShaderForTess_abi_cxx11_();
    local_340._0_8_ = (ulong)(uint)local_340._4_4_ << 0x20;
    local_340._8_8_ = &local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_340 + 8),local_3d0._0_8_,
               (pointer)(local_3d0._8_8_ + local_3d0._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_340._0_8_ & 0xffffffff),(value_type *)(local_340 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != &local_328) {
      operator_delete((void *)local_340._8_8_,(ulong)(local_328._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    local_3d0._16_8_ = (pointer)0x6e6f635f73736574;
    local_3b8._M_impl._0_4_ = 0x6c6f7274;
    local_3d0._8_8_ = (pointer)0xc;
    local_3b8._M_impl._4_1_ = '\0';
    local_3d0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_3d0 + 0x10);
    local_368 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_3d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(vertices = 1) out;\n\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"void main (void)\n{\n",0x13);
    iVar5 = 0;
    iVar12 = 0;
    bVar3 = true;
    do {
      bVar18 = bVar3;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_TessLevelInner[",0x13);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_340,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] = 1.0;\n",9);
      iVar5 = 1;
      bVar3 = false;
    } while (bVar18);
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"\tgl_TessLevelOuter[",0x13);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_340,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] = 1.0;\n",9);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
    std::ios_base::~ios_base(local_2d0);
    local_1c0._0_4_ = 3;
    pcVar10 = local_1b0[0]._M_local_buf + 8;
    local_1c0._8_8_ = pcVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_368->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != pcVar10) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    local_3d0._16_8_ = (pointer)0x6176655f73736574;
    local_3b8._M_impl._0_2_ = 0x6c;
    local_3d0._8_8_ = (pointer)0x9;
    local_3d0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_3d0 + 0x10);
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_3d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n",0x41);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_340,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(isolines, equal_spacing) in;\n\n",0x25);
    anon_unknown_0::BufferIoExecutor::declareBufferBlocks((ostream *)local_340,shaderSpec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"void main (void)\n{\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\tgl_Position = vec4(gl_TessCoord.x, 0.0, 0.0, 1.0);\n",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,
               "\thighp uint invocationId = uint(gl_PrimitiveID)*2u + (gl_TessCoord.x > 0.5 ? 1u : 0u);\n"
               ,0x57);
    anon_unknown_0::BufferIoExecutor::generateExecBufferIo
              ((ostream *)local_340,shaderSpec,"invocationId");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
    std::ios_base::~ios_base(local_2d0);
    local_1c0._0_4_ = 4;
    local_1c0._8_8_ = pcVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != pcVar10) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x67617266;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    local_1c0._0_8_ = local_1b0;
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    (anonymous_namespace)::generateEmptyFragmentSource_abi_cxx11_();
    local_340._0_4_ = 1;
    local_340._8_8_ = &local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_340 + 8),local_3d0._0_8_,
               (pointer)(local_3d0._8_8_ + local_3d0._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_340._0_8_ & 0xffffffff),(value_type *)(local_340 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != &local_328) {
      operator_delete((void *)local_340._8_8_,(ulong)(local_328._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ == local_1b0) {
      return;
    }
LAB_00806670:
    ppSVar14 = (pointer)CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_1b0[0]._M_allocated_capacity);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._0_8_;
LAB_00806df6:
    uVar15 = (long)ppSVar14 + 1;
    goto LAB_00807474;
  case SHADERTYPE_COMPUTE:
    local_3d0._8_8_ = (pointer)0x7;
    local_3d0._16_8_ = (pointer)0x657475706d6f63;
    local_3d0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_3d0 + 0x10);
    pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&dst->glslSources,(string *)local_3d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"#version 310 es\n",0x10);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_340,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(local_size_x = 1) in;\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
    anon_unknown_0::BufferIoExecutor::declareBufferBlocks((ostream *)local_340,shaderSpec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,
               "\tuint invocationNdx = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z\n",
               0x4d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,
               "\t                   + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n",
               0x4e);
    anon_unknown_0::BufferIoExecutor::generateExecBufferIo
              ((ostream *)local_340,shaderSpec,"invocationNdx");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
    std::ios_base::~ios_base(local_2d0);
    local_1c0._0_4_ = 5;
    local_1c0._8_8_ = local_1b0[0]._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar8->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != local_1b0[0]._M_local_buf + 8) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    ppSVar14 = (pointer)local_3d0._16_8_;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3d0 + 0x10)) {
      return;
    }
    goto LAB_00806df6;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Unsupported shader type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
               ,0xb2b);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar15 = local_3d0._16_8_ - local_3d0._0_8_;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._0_8_;
LAB_00807474:
    operator_delete(paVar16,uVar15);
  }
  return;
}

Assistant:

void generateSources (glu::ShaderType shaderType, const ShaderSpec& shaderSpec, vk::SourceCollections& dst)
{
	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:					VertexShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_TESSELLATION_CONTROL:		TessControlExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:	TessEvaluationExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_GEOMETRY:					GeometryShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_FRAGMENT:					FragmentShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_COMPUTE:					ComputeShaderExecutor::generateSources	(shaderSpec, dst);	break;
		default:
			TCU_THROW(InternalError, "Unsupported shader type");
	}
}